

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

bool __thiscall
glcts::TextureCubeMapArraySubImage3D::checkResults
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  DataBufferVec result_data_buffer;
  allocator_type local_69;
  GLuint local_68;
  GLuint local_64;
  ulong local_60;
  ulong local_58;
  value_type_conflict4 local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = height * width * 4;
  local_60 = (ulong)(iVar1 * depth);
  local_4c = 0;
  local_68 = width;
  local_64 = height;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,local_60,&local_4c,
             &local_69);
  local_58 = (ulong)depth;
  uVar5 = 0;
  for (uVar4 = 0; local_58 != uVar4; uVar4 = uVar4 + 1) {
    (**(code **)(lVar3 + 0x6b8))(0x8ca8,0x8ce0,this->m_tex_cube_map_array_id,0,uVar4 & 0xffffffff);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not attach texture object to framebuffer\'s attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x1bc);
    TestCaseBase::checkFramebufferStatus(&this->super_TestCaseBase,0x8ca8);
    (**(code **)(lVar3 + 0x1220))
              (0,0,local_68,local_64,0x8d99,0x1405,
               local_48._M_impl.super__Vector_impl_data._M_start + uVar5);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not read pixels from framebuffer\'s attachment!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x1c4);
    uVar5 = uVar5 + iVar1;
  }
  iVar1 = bcmp(local_48._M_impl.super__Vector_impl_data._M_start,
               (this->m_expected_data_buffer).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,local_60 << 2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return iVar1 == 0;
}

Assistant:

bool TextureCubeMapArraySubImage3D::checkResults(glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint   n_elements = width * height * depth * m_n_components;
	DataBufferVec result_data_buffer(n_elements, 0);

	for (glw::GLuint layer_nr = 0; layer_nr < depth; ++layer_nr)
	{
		/* attach one layer to framebuffer's attachment */
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_tex_cube_map_array_id, 0, layer_nr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to framebuffer's attachment");

		/* check framebuffer status */
		checkFramebufferStatus(GL_READ_FRAMEBUFFER);

		/* read data from the texture */
		gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					  &result_data_buffer[layer_nr * width * height * m_n_components]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels from framebuffer's attachment!");
	}

	return memcmp(&result_data_buffer[0], &m_expected_data_buffer[0], n_elements * sizeof(glw::GLuint)) == 0;
}